

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O1

char * auth_digest_string_quoted(char *source)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *d;
  size_t sVar4;
  
  sVar4 = 1;
  pcVar2 = source;
  do {
    cVar1 = *pcVar2;
    if (cVar1 == '\"') {
LAB_006926db:
      sVar4 = sVar4 + 2;
    }
    else {
      if (cVar1 == '\0') {
        pcVar3 = (char *)(*Curl_cmalloc)(sVar4);
        pcVar2 = pcVar3;
        if (pcVar3 == (char *)0x0) {
          return (char *)0x0;
        }
        do {
          cVar1 = *source;
          if ((cVar1 == '\"') || (cVar1 == '\\')) {
            *pcVar2 = '\\';
            pcVar2 = pcVar2 + 1;
          }
          else if (cVar1 == '\0') {
            *pcVar2 = '\0';
            return pcVar3;
          }
          cVar1 = *source;
          source = source + 1;
          *pcVar2 = cVar1;
          pcVar2 = pcVar2 + 1;
        } while( true );
      }
      if (cVar1 == '\\') goto LAB_006926db;
      sVar4 = sVar4 + 1;
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

static char *auth_digest_string_quoted(const char *source)
{
  char *dest;
  const char *s = source;
  size_t n = 1; /* null terminator */

  /* Calculate size needed */
  while(*s) {
    ++n;
    if(*s == '"' || *s == '\\') {
      ++n;
    }
    ++s;
  }

  dest = malloc(n);
  if(dest) {
    char *d = dest;
    s = source;
    while(*s) {
      if(*s == '"' || *s == '\\') {
        *d++ = '\\';
      }
      *d++ = *s++;
    }
    *d = '\0';
  }

  return dest;
}